

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

double * __thiscall
TPZSkylMatrix<double>::operator()(TPZSkylMatrix<double> *this,int64_t r,int64_t c)

{
  double **ppdVar1;
  double *pdVar2;
  long lVar3;
  
  lVar3 = r - c;
  if (lVar3 == 0 || r < c) {
    lVar3 = -(r - c);
    r = c;
  }
  ppdVar1 = (this->fElem).fStore;
  pdVar2 = ppdVar1[r];
  if ((long)ppdVar1[r + 1] - (long)pdVar2 >> 3 <= lVar3) {
    TPZMatrix<double>::Error
              ("TVar &TPZSkylMatrix<double>::operator()(const int64_t, const int64_t) [TVar = double]"
               ,"Index out of range");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzskylmat.cpp"
               ,0xc5);
  }
  return pdVar2 + lVar3;
}

Assistant:

TVar &
TPZSkylMatrix<TVar>::operator()(const int64_t r, const int64_t c) {
	int64_t row(r),col(c);
	if ( row > col ) this->Swap( &row, &col );
	
	// Indice do vetor coluna.
	int64_t index = col - row;
	if ( index >= Size(col) ) {
		//Error("TPZSkylMatrix::operator()","Index out of range");
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"Index out of range");
		DebugStop();
	}
	return fElem[col][index];
}